

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetInsertOneFanin(Wln_Ret_t *p,int iObj,int iFlop)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  bool bVar5;
  int *pFanins;
  int *pLink;
  int iFanin;
  int iHead;
  int k;
  int iFlop_local;
  int iObj_local;
  Wln_Ret_t *p_local;
  
  piVar3 = Wln_RetFanins(p,iObj);
  iVar1 = Wln_ObjIsFf(p->pNtk,iFlop);
  if (iVar1 != 0) {
    iFanin = 0;
    while( true ) {
      iVar1 = Wln_ObjFaninNum(p->pNtk,iObj);
      bVar5 = false;
      if (iFanin < iVar1) {
        piVar4 = Wln_RetFanins(p,iObj);
        pLink._4_4_ = piVar4[iFanin << 1];
        piVar4 = Wln_RetFanins(p,iObj);
        bVar5 = piVar4 + (iFanin << 1) != (int *)0xfffffffffffffffc;
      }
      if (!bVar5) break;
      if (((pLink._4_4_ != 0) &&
          ((iVar1 = Wln_ObjFaninNum(p->pNtk,pLink._4_4_), iVar1 != 0 ||
           (iVar1 = Wln_ObjIsCi(p->pNtk,pLink._4_4_), iVar1 != 0)))) &&
         ((iVar1 = Wln_ObjIsFf(p->pNtk,iObj), iVar1 == 0 || (iFanin < 1)))) {
        iVar1 = piVar3[iFanin * 2 + 1];
        iVar2 = Vec_IntSize(&p->vEdgeLinks);
        piVar3[iFanin * 2 + 1] = iVar2;
        Vec_IntPushTwo(&p->vEdgeLinks,iVar1,iFlop);
      }
      iFanin = iFanin + 1;
    }
    return;
  }
  __assert_fail("Wln_ObjIsFf( p->pNtk, iFlop )",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnRetime.c"
                ,0x1cd,"void Wln_RetInsertOneFanin(Wln_Ret_t *, int, int)");
}

Assistant:

void Wln_RetInsertOneFanin( Wln_Ret_t * p, int iObj, int iFlop )
{
    int k, iHead, iFanin, * pLink;
    int * pFanins  = Wln_RetFanins( p, iObj );
    assert( Wln_ObjIsFf( p->pNtk, iFlop ) );
    Wln_RetForEachFanin( p, iObj, iFanin, pLink, k )
    {
        if ( Wln_ObjIsFf(p->pNtk, iObj) && k > 0 )
            continue;
        iHead = pFanins[2*k+1];
        pFanins[2*k+1] = Vec_IntSize(&p->vEdgeLinks);
        Vec_IntPushTwo( &p->vEdgeLinks, iHead, iFlop );
    }
}